

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp-inl.h
# Opt level: O0

RefPtr<wabt::interp::Trap> * __thiscall
wabt::interp::RefPtr<wabt::interp::Object>::As<wabt::interp::Trap>
          (RefPtr<wabt::interp::Trap> *__return_storage_ptr__,RefPtr<wabt::interp::Object> *this)

{
  Store *this_00;
  bool bVar1;
  Ref ref;
  Index IVar2;
  RefPtr<wabt::interp::Object> *this_local;
  RefPtr<wabt::interp::Trap> *result;
  
  this_00 = this->store_;
  ref = Object::self(this->obj_);
  bVar1 = Store::Is<wabt::interp::Trap>(this_00,ref);
  if (bVar1) {
    interp::RefPtr<wabt::interp::Trap>::RefPtr(__return_storage_ptr__);
    __return_storage_ptr__->obj_ = (Trap *)this->obj_;
    __return_storage_ptr__->store_ = this->store_;
    IVar2 = Store::CopyRoot(this->store_,this->root_index_);
    __return_storage_ptr__->root_index_ = IVar2;
    return __return_storage_ptr__;
  }
  __assert_fail("store_->Is<U>(obj_->self())",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/include/wabt/interp/interp-inl.h"
                ,0x15a,
                "RefPtr<U> wabt::interp::RefPtr<wabt::interp::Object>::As() [T = wabt::interp::Object, U = wabt::interp::Trap]"
               );
}

Assistant:

RefPtr<U> RefPtr<T>::As() {
  static_assert(std::is_base_of<T, U>::value, "T must be base class of U");
  assert(store_->Is<U>(obj_->self()));
  RefPtr<U> result;
  result.obj_ = static_cast<U*>(obj_);
  result.store_ = store_;
  result.root_index_ = store_->CopyRoot(root_index_);
  return result;
}